

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.c
# Opt level: O2

void QuickSort(int *sort,int start,int end)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  do {
    if (end <= start) {
      return;
    }
    iVar1 = sort[start];
    uVar2 = (ulong)(uint)end;
    uVar5 = (ulong)(uint)start;
LAB_00101167:
    iVar6 = (int)uVar5;
    uVar7 = (ulong)iVar6;
    if (iVar6 < (int)uVar2) {
      uVar2 = (ulong)(int)uVar2;
      lVar3 = uVar2 << 0x20;
      for (; (long)uVar7 < (long)uVar2; uVar2 = uVar2 - 1) {
        if (sort[uVar2] < iVar1) {
          sort[uVar7] = sort[uVar2];
          uVar7 = (ulong)(iVar6 + 1);
          break;
        }
        lVar3 = lVar3 + -0x100000000;
      }
      uVar4 = lVar3 >> 0x20;
      uVar5 = uVar4;
      if ((long)uVar4 < (long)uVar7) {
        uVar5 = uVar7;
      }
      for (; (long)uVar7 < (long)uVar4; uVar7 = uVar7 + 1) {
        if (iVar1 <= sort[uVar7]) {
          sort[uVar4] = sort[uVar7];
          uVar2 = (ulong)((int)uVar2 - 1);
          uVar5 = uVar7;
          break;
        }
      }
      goto LAB_00101167;
    }
    sort[uVar7] = iVar1;
    QuickSort(sort,start,iVar6 + -1);
    start = iVar6 + 1;
  } while( true );
}

Assistant:

void QuickSort(int sort[],int start,int end){
    if(start >= end)
        return;
    int i = start;
    int j = end;
    int baseval = sort[start];
    while(i < j){
        //从右往左找比基准数小的数
        while(i < j && sort[j] >= baseval){
            j--;
        }
        if(i < j){      //交换
            sort[i] = sort[j];
            i++;        //减少一次寻找比基准数大的数
        }
        //从左往右找比基准数大的数
        while(i < j && sort[i] < baseval){
            i++;
        }
        if(i < j){      //交换
            sort[j] = sort[i];
            j--;    //减少一次寻找比基准数小的数
        }
    }
    //把基准数放到i的位置
    sort[i] = baseval;
    //递归
    QuickSort(sort,start,i - 1);  //快速排序基准数之前的
    QuickSort(sort,i + 1,end);    //快速排序基准数之后的
}